

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte *in_RDI;
  bool bVar2;
  char_t *end_1;
  char_t *end;
  char_t ss;
  char_t *begin;
  gap g;
  char_t *in_stack_ffffffffffffffc0;
  gap *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar3;
  byte *s_00;
  gap local_20;
  byte *local_10;
  
  local_10 = in_RDI;
  gap::gap(&local_20);
  s_00 = local_10;
  do {
    while (bVar3 = *local_10, ((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
LAB_0013526d:
      if (*local_10 == 0x3c) {
        pbVar1 = (byte *)gap::flush(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        while( true ) {
          bVar2 = false;
          if (s_00 < pbVar1) {
            bVar2 = ((anonymous_namespace)::chartype_table[pbVar1[-1]] & 8) != 0;
          }
          if (!bVar2) break;
          pbVar1 = pbVar1 + -1;
        }
        *pbVar1 = 0;
        return (char_t *)(local_10 + 1);
      }
      if (*local_10 == 0x26) {
        local_10 = (byte *)strconv_escape((char_t *)s_00,
                                          (gap *)CONCAT17(bVar3,in_stack_ffffffffffffffd0));
      }
      else {
        if (*local_10 == 0) {
          pbVar1 = (byte *)gap::flush(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
          while( true ) {
            bVar2 = false;
            if (s_00 < pbVar1) {
              bVar2 = ((anonymous_namespace)::chartype_table[pbVar1[-1]] & 8) != 0;
            }
            if (!bVar2) break;
            pbVar1 = pbVar1 + -1;
          }
          *pbVar1 = 0;
          return (char_t *)local_10;
        }
        local_10 = local_10 + 1;
      }
    }
    bVar3 = local_10[1];
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
      local_10 = local_10 + 1;
      goto LAB_0013526d;
    }
    bVar3 = local_10[2];
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
      local_10 = local_10 + 2;
      goto LAB_0013526d;
    }
    bVar3 = local_10[3];
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
      local_10 = local_10 + 3;
      goto LAB_0013526d;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}